

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O1

void __thiscall pbrt::ThreadPool::workerFunc(ThreadPool *this,int tIndex)

{
  long in_FS_OFFSET;
  string ret;
  unique_lock<std::mutex> lock;
  int local_4c;
  string local_48;
  unique_lock<std::mutex> local_28;
  
  local_4c = tIndex;
  if (LOGGING_LogLevel < 1) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    detail::stringPrintfRecursive<int&>(&local_48,"Started execution in worker thread %d",&local_4c)
    ;
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.cpp"
        ,0x8a,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
  }
  *(int *)(in_FS_OFFSET + -0x488) = local_4c;
  local_28._M_device = &this->jobListMutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  while (this->shutdownThreads == false) {
    WorkOrWait(this,&local_28);
  }
  if (LOGGING_LogLevel < 1) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    detail::stringPrintfRecursive<int&>(&local_48,"Exiting worker thread %d",&local_4c);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.cpp"
        ,0x91,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void ThreadPool::workerFunc(int tIndex) {
    LOG_VERBOSE("Started execution in worker thread %d", tIndex);
    ThreadIndex = tIndex;

    std::unique_lock<std::mutex> lock(jobListMutex);
    while (!shutdownThreads)
        WorkOrWait(&lock);

    LOG_VERBOSE("Exiting worker thread %d", tIndex);
}